

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O1

Bdd * __thiscall sylvan::Bdd::operator*=(Bdd *this,Bdd *other)

{
  Task local_50;
  
  local_50.d._0_8_ = this->bdd;
  local_50.d._8_8_ = other->bdd;
  local_50.f = sylvan_and_WRAP;
  local_50.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  local_50.d[0x10] = '\0';
  local_50.d[0x11] = '\0';
  local_50.d[0x12] = '\0';
  local_50.d[0x13] = '\0';
  lace_run_task(&local_50);
  this->bdd = local_50.d._0_8_;
  return this;
}

Assistant:

Bdd&
Bdd::operator*=(const Bdd& other)
{
    bdd = sylvan_and(bdd, other.bdd);
    return *this;
}